

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Triplets.h
# Opt level: O0

void __thiscall
iDynTree::Triplets::addSubMatrix<(iDynTree::MatrixStorageOrdering)0>
          (Triplets *this,size_t startingRow,size_t startingColumn,
          SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *matrix)

{
  size_t sVar1;
  VectorDynSize *pVVar2;
  bool bVar3;
  pointer pvVar4;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_RDX;
  ConstIterator *in_RSI;
  vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *in_RDI;
  const_iterator it;
  ConstIterator *in_stack_ffffffffffffff38;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_stack_ffffffffffffff40;
  ConstIterator *this_00;
  size_type in_stack_ffffffffffffff68;
  vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *in_stack_ffffffffffffff70;
  ConstIterator local_50;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *local_18;
  ConstIterator *local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::size(in_RDI);
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::numberOfNonZeros
            ((SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *)0x77711b);
  std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::reserve
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::begin(in_stack_ffffffffffffff40);
  while( true ) {
    SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::end(in_stack_ffffffffffffff40);
    bVar3 = SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator!=
                      ((ConstIterator *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
    if (!bVar3) break;
    in_stack_ffffffffffffff38 = local_10;
    pvVar4 = SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator->(&local_50);
    this_00 = (ConstIterator *)((long)&in_stack_ffffffffffffff38->m_matrix + pvVar4->row);
    in_stack_ffffffffffffff40 = local_18;
    pvVar4 = SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator->(&local_50);
    sVar1 = pvVar4->column;
    pVVar2 = &in_stack_ffffffffffffff40->m_values;
    pvVar4 = SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator->(&local_50);
    Triplet::Triplet((Triplet *)&stack0xffffffffffffff68,(size_t)this_00,
                     (long)&pVVar2->_vptr_VectorDynSize + sVar1,pvVar4->value);
    std::vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_>::push_back
              ((vector<iDynTree::Triplet,_std::allocator<iDynTree::Triplet>_> *)
               in_stack_ffffffffffffff40,(value_type *)in_stack_ffffffffffffff38);
    SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::ConstIterator::operator++(this_00);
  }
  return;
}

Assistant:

void addSubMatrix(std::size_t startingRow,
                      std::size_t startingColumn,
                      const SparseMatrix<ordering>& matrix)
    {
        //if enough memory has been reserved this should be a noop
        m_triplets.reserve(m_triplets.size() + matrix.numberOfNonZeros());

        for (typename SparseMatrix<ordering>::const_iterator it(matrix.begin());
             it != matrix.end(); ++it) {
            m_triplets.push_back(Triplet(startingRow + it->row,
                                         startingColumn + it->column,
                                         it->value));
        }
    }